

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priExtendPrime(word *p,size_t l,word *q,size_t n,size_t trials,size_t base_count,gen_i rng,
                     void *rng_state,void *stack)

{
  bool_t bVar1;
  undefined8 *in_stack_00000018;
  size_t in_stack_00000020;
  word *in_stack_00000028;
  word *a;
  size_t in_stack_00000068;
  gen_i in_stack_00000070;
  void *in_stack_00000078;
  
  *in_stack_00000018 = 1;
  bVar1 = priExtendPrime2((word *)n,trials,(word *)base_count,(size_t)a,in_stack_00000028,
                          in_stack_00000020,(size_t)p,in_stack_00000068,in_stack_00000070,
                          in_stack_00000078,rng);
  return bVar1;
}

Assistant:

bool_t priExtendPrime(word p[], size_t l, const word q[], size_t n,
	size_t trials, size_t base_count, gen_i rng, void* rng_state, void* stack)
{
	word* a;
	// pre
	ASSERT(memIsValid(stack, O_OF_W(1)));
	// a <- 1
	a = (word*)stack;
	a[0] = 1;
	// расширить
	return priExtendPrime2(p, l, q, n, a, 1, trials, base_count, 
		rng, rng_state, a + 1);
}